

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintingTheDecimalEquivalentOfABinaryNumber.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  ulong in_RAX;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    printf("%s","Enter a valid binary number (up to 5 digits): ");
    __isoc99_scanf("%d",(long)&uStack_38 + 4);
    if (uStack_38._4_4_ < 0x2b68) {
      uVar2 = uStack_38._4_4_ - 10000;
      uVar1 = uStack_38._4_4_;
      if (9999 < uStack_38._4_4_) {
        uVar1 = uVar2;
      }
      uVar5 = uVar1 + ((uVar1 & 0xffff) / 1000) * -1000;
      uVar6 = uVar5 + ((uVar5 & 0xffff) * 0x290 >> 0x10) * -100;
      cVar4 = (char)uVar6 + ((byte)(uVar6 * 0x67 >> 9) & 0x7e) * -5;
      uStack_38 = (ulong)CONCAT14(cVar4,(undefined4)uStack_38);
      uVar3 = (ulong)(uVar2 < 10000) << 4;
      if (uVar1 - 1000 < 1000) {
        uVar3 = (ulong)((uint)(uVar2 < 10000) << 4 | 8);
      }
      else if (999 < uVar1) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",(long)&uStack_38 + 4);
      }
      if ((uVar5 & 0xffff) - 100 < 100) {
        uVar3 = (ulong)((int)uVar3 + 4);
      }
      else if (99 < (ushort)uVar5) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",(long)&uStack_38 + 4);
      }
      if ((uVar6 & 0xffff) - 10 < 10) {
        uVar3 = (ulong)((int)uVar3 + 2);
      }
      else if (9 < (ushort)uVar6) {
        puts("You have not entered a binary number");
        printf("%s","Enter a valid binary number (up to 5 digits): ");
        __isoc99_scanf("%d",(long)&uStack_38 + 4);
      }
      if (cVar4 == '\0') goto LAB_0010131a;
      if (cVar4 == '\x01') {
        uVar3 = (ulong)((int)uVar3 + 1);
LAB_0010131a:
        printf("%s%d","The decimal equivalent is: ",uVar3);
        return 0;
      }
    }
    puts("You have not entered a binary number");
  } while( true );
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;
    int numE;
    int decimal = 0;

    printf("%s", "Enter a valid binary number (up to 5 digits): ");
    scanf("%d", &number);
    while (flag != -1) {
        decimal = 0;
        if (number >= 0) {
            if (number <= 11111) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                numC = number / 100;
                number = number % 100;
                numD = number / 10;
                number = number % 10;
                numE = number;
                if (numA == 1) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else if (numA == 0) {
                    decimal = decimal + (numA * 16);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numB == 1) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else if (numB == 0) {
                    decimal = decimal + (numB * 8);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numC == 1) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else if (numC == 0) {
                    decimal = decimal + (numC * 4);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numD == 1) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else if (numD == 0) {
                    decimal = decimal + (numD * 2);
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

                if (numE == 1) {
                    decimal = decimal + numE ;
                    flag = -1;

                }
                else if (numE == 0) {
                    decimal = decimal + numE;
                    flag = -1;

                }
                else {
                    puts("You have not entered a binary number");
                    printf("%s", "Enter a valid binary number (up to 5 digits): ");
                    scanf("%d", &number);
                    flag = 1;

                }

            }
            else {
                puts("You have not entered a binary number");
                printf("%s", "Enter a valid binary number (up to 5 digits): ");
                scanf("%d", &number);
                flag = 1;

            }

        }
        else {
            puts("You have not entered a binary number");
            printf("%s", "Enter a valid binary number (up to 5 digits): ");
            scanf("%d", &number);
            flag = 1;

        }

    }
    printf("%s%d", "The decimal equivalent is: ", decimal);

    return 0;

}